

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O3

void test_master_table_delete(planck_unit_test_t *tc)

{
  MasterTable *in_RSI;
  
  ion_init_master_table();
  master_table_close(tc,in_RSI);
  remove("ion_mt.tbl");
  master_table_init(tc,in_RSI);
  ion_delete_master_table();
  return;
}

Assistant:

void
test_master_table_delete(
	planck_unit_test_t *tc
) {
	MasterTable *master_table = new MasterTable();

	master_table_setup(tc, master_table);
	master_table_init(tc, master_table);
	delete master_table;
}